

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RhoZ.cpp
# Opt level: O2

void __thiscall OpenMD::RhoZ::process(RhoZ *this)

{
  SelectionManager *this_00;
  char cVar1;
  int iVar2;
  uint uVar3;
  SimInfo *info;
  Snapshot *this_01;
  pointer pvVar4;
  long lVar5;
  pointer pdVar6;
  long lVar7;
  uint i;
  ulong uVar8;
  uint uVar9;
  RealType RVar10;
  double dVar11;
  double dVar12;
  StuntDouble *sd;
  int ii;
  Vector3d pos;
  Mat3x3d hmat;
  DumpReader reader;
  value_type local_1320;
  int local_1314;
  SelectionEvaluator *local_1310;
  vector<double,_std::allocator<double>_> *local_1308;
  ulong local_1300;
  ulong local_12f8;
  int local_12ec;
  SelectionSet local_12e8;
  Mat3x3d local_12d0;
  DumpReader local_1288;
  
  info = (this->super_StaticAnalyser).info_;
  cVar1 = (info->simParams_->UsePeriodicBoundaryConditions).super_ParameterBase.field_0x2b;
  DumpReader::DumpReader(&local_1288,info,&(this->super_StaticAnalyser).dumpFilename_);
  local_1314 = DumpReader::getNFrames(&local_1288);
  iVar2 = (this->super_StaticAnalyser).step_;
  pdVar6 = (pointer)((long)local_1314 % (long)iVar2 & 0xffffffff);
  this->nProcessed_ = local_1314 / iVar2;
  local_1308 = &this->zBox_;
  local_1310 = &this->evaluator_;
  this_00 = &this->seleMan_;
  uVar8 = 0;
  while ((int)uVar8 < local_1314) {
    local_1300 = uVar8;
    DumpReader::readFrame(&local_1288,(int)uVar8);
    this_01 = ((this->super_StaticAnalyser).info_)->sman_->currentSnapshot_;
    this->currentSnapshot_ = this_01;
    uVar3 = (this->super_StaticAnalyser).nBins_;
    pvVar4 = (this->sliceSDLists_).
             super__Vector_base<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    for (lVar7 = 0; (ulong)uVar3 * 0x18 - lVar7 != 0; lVar7 = lVar7 + 0x18) {
      lVar5 = *(long *)((long)&(pvVar4->
                               super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                               )._M_impl.super__Vector_impl_data._M_start + lVar7);
      if (*(long *)((long)&(pvVar4->
                           super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                           )._M_impl.super__Vector_impl_data._M_finish + lVar7) != lVar5) {
        *(long *)((long)&(pvVar4->
                         super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                         )._M_impl.super__Vector_impl_data._M_finish + lVar7) = lVar5;
      }
    }
    RVar10 = Snapshot::getVolume(this_01);
    local_12f8 = (ulong)(this->super_StaticAnalyser).nBins_;
    Snapshot::getHmat(&local_12d0,this->currentSnapshot_);
    std::vector<double,_std::allocator<double>_>::push_back
              (local_1308,
               (value_type_conflict2 *)
               ((long)local_12d0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                      data_ + (ulong)(uint)this->axis_ * 0x20));
    if ((this->evaluator_).isDynamic_ == true) {
      SelectionEvaluator::evaluate(&local_12e8,local_1310);
      SelectionManager::setSelectionSet(this_00,&local_12e8);
      std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                (&local_12e8.bitsets_);
    }
    local_1320 = SelectionManager::beginSelected(this_00,&local_12ec);
    dVar11 = (double)(long)local_12f8;
    while (local_1320 != (StuntDouble *)0x0) {
      StuntDouble::getPos((Vector3d *)&local_12e8,local_1320);
      if (cVar1 != '\0') {
        Snapshot::wrapVector(this->currentSnapshot_,(Vector3d *)&local_12e8);
      }
      StuntDouble::setPos(local_1320,(Vector3d *)&local_12e8);
      local_1320 = SelectionManager::nextSelected(this_00,&local_12ec);
    }
    local_1320 = SelectionManager::beginSelected(this_00,&local_12ec);
    while (local_1320 != (StuntDouble *)0x0) {
      StuntDouble::getPos((Vector3d *)&local_12e8,local_1320);
      uVar3 = (this->super_StaticAnalyser).nBins_;
      std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::push_back
                ((this->sliceSDLists_).
                 super__Vector_base<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start +
                 (int)((uint)(int)(((double)(&local_12e8.bitsets_.
                                              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                              ._M_impl.super__Vector_impl_data._M_start)
                                            [(uint)this->axis_] /
                                    *(double *)
                                     ((long)local_12d0.super_SquareMatrix<double,_3>.
                                            super_RectMatrix<double,_3U,_3U>.data_ +
                                     (ulong)(uint)this->axis_ * 0x20) + 0.5) * (double)uVar3) %
                      uVar3),&local_1320);
      local_1320 = SelectionManager::nextSelected(this_00,&local_12ec);
    }
    uVar3 = (this->super_StaticAnalyser).nBins_;
    pvVar4 = (this->sliceSDLists_).
             super__Vector_base<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pdVar6 = (this->density_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (uVar8 = 0; uVar8 != uVar3; uVar8 = uVar8 + 1) {
      lVar7 = *(long *)&pvVar4[uVar8].
                        super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                        ._M_impl.super__Vector_impl_data;
      dVar12 = 0.0;
      for (uVar9 = 0;
          (ulong)uVar9 <
          (ulong)((long)pvVar4[uVar8].
                        super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish - lVar7 >> 3); uVar9 = uVar9 + 1)
      {
        dVar12 = dVar12 + *(double *)(*(long *)(lVar7 + (ulong)uVar9 * 8) + 0x38);
      }
      pdVar6[uVar8] = dVar12 / (RVar10 / dVar11) + pdVar6[uVar8];
    }
    local_1320 = (value_type)0x0;
    uVar8 = (ulong)(uint)((int)local_1300 + (this->super_StaticAnalyser).step_);
  }
  (*(this->super_StaticAnalyser)._vptr_StaticAnalyser[4])(this,uVar8,pdVar6);
  DumpReader::~DumpReader(&local_1288);
  return;
}

Assistant:

void RhoZ::process() {
    StuntDouble* sd;
    int ii;

    bool usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();

    DumpReader reader(info_, dumpFilename_);
    int nFrames = reader.getNFrames();
    nProcessed_ = nFrames / step_;

    for (int istep = 0; istep < nFrames; istep += step_) {
      reader.readFrame(istep);
      currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();

      for (unsigned int i = 0; i < nBins_; i++) {
        sliceSDLists_[i].clear();
      }

      RealType sliceVolume = currentSnapshot_->getVolume() / nBins_;
      Mat3x3d hmat         = currentSnapshot_->getHmat();
      zBox_.push_back(hmat(axis_, axis_));

      // RealType halfBoxZ_ = hmat(axis_,axis_) / 2.0;

      if (evaluator_.isDynamic()) {
        seleMan_.setSelectionSet(evaluator_.evaluate());
      }

      // wrap the stuntdoubles into a cell
      for (sd = seleMan_.beginSelected(ii); sd != NULL;
           sd = seleMan_.nextSelected(ii)) {
        Vector3d pos = sd->getPos();
        if (usePeriodicBoundaryConditions_) currentSnapshot_->wrapVector(pos);
        sd->setPos(pos);
      }

      // determine which atom belongs to which slice
      for (sd = seleMan_.beginSelected(ii); sd != NULL;
           sd = seleMan_.nextSelected(ii)) {
        Vector3d pos = sd->getPos();
        // shift molecules by half a box to have bins start at 0
        // int binNo = int(nBins_ * (halfBoxZ_ + pos[axis_]) /
        // hmat(axis_,axis_)); = int(nBins_ * ( 0.5 + pos[axis_] /
        // hmat(axis_,axis_) ) Shift molecules by half a box to have bins start
        // at 0 The modulo operator is used to wrap the case when we are beyond
        // the end of the bins back to the beginning. (from RNEMD.cpp)
        int binNo =
            int(nBins_ * (pos[axis_] / hmat(axis_, axis_) + 0.5)) % nBins_;
        sliceSDLists_[binNo].push_back(sd);
      }

      // loop over the slices to calculate the densities
      for (unsigned int i = 0; i < nBins_; i++) {
        RealType totalMass = 0;
        for (unsigned int k = 0; k < sliceSDLists_[i].size(); ++k) {
          totalMass += sliceSDLists_[i][k]->getMass();
        }
        density_[i] += totalMass / sliceVolume;
      }
    }

    writeDensity();
  }